

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::createConditionalBranch(Builder *this,Id condition,Block *thenBlock,Block *elseBlock)

{
  Block *this_00;
  Id IVar1;
  Instruction *pIVar2;
  undefined4 in_register_00000034;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_48 [3];
  Instruction *local_30;
  Instruction *branch;
  Block *elseBlock_local;
  Block *thenBlock_local;
  Builder *pBStack_10;
  Id condition_local;
  Builder *this_local;
  
  branch = (Instruction *)elseBlock;
  elseBlock_local = thenBlock;
  thenBlock_local._4_4_ = condition;
  pBStack_10 = this;
  pIVar2 = (Instruction *)
           Instruction::operator_new((Instruction *)0x38,CONCAT44(in_register_00000034,condition));
  Instruction::Instruction(pIVar2,OpBranchConditional);
  local_30 = pIVar2;
  Instruction::addIdOperand(pIVar2,thenBlock_local._4_4_);
  pIVar2 = local_30;
  IVar1 = Block::getId(elseBlock_local);
  Instruction::addIdOperand(pIVar2,IVar1);
  pIVar2 = local_30;
  IVar1 = Block::getId((Block *)branch);
  Instruction::addIdOperand(pIVar2,IVar1);
  this_00 = this->buildPoint;
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_48,local_30
            );
  Block::addInstruction(this_00,local_48);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(local_48);
  Block::addPredecessor(elseBlock_local,this->buildPoint);
  Block::addPredecessor((Block *)branch,this->buildPoint);
  return;
}

Assistant:

void Builder::createConditionalBranch(Id condition, Block* thenBlock, Block* elseBlock)
{
    Instruction* branch = new Instruction(OpBranchConditional);
    branch->addIdOperand(condition);
    branch->addIdOperand(thenBlock->getId());
    branch->addIdOperand(elseBlock->getId());
    buildPoint->addInstruction(std::unique_ptr<Instruction>(branch));
    thenBlock->addPredecessor(buildPoint);
    elseBlock->addPredecessor(buildPoint);
}